

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Pipeline * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::sendForPipeline
          (Pipeline *__return_storage_ptr__,RpcRequest *this)

{
  ushort uVar1;
  RpcConnectionState *pRVar2;
  RpcClient *pRVar3;
  void *pvVar4;
  undefined8 uVar5;
  PointerReader other;
  ClientHook *pCVar6;
  RpcPipeline *pRVar7;
  byte bVar8;
  uint uVar9;
  void *__buf;
  int in_R8D;
  MessageSize MVar10;
  Request<capnp::AnyPointer,_capnp::AnyPointer> replacement;
  size_t sVar11;
  Own<capnp::ClientHook,_std::nullptr_t> local_288;
  undefined1 local_270 [8];
  uint64_t local_268;
  uint local_260;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t> local_258;
  Own<capnp::PipelineHook,_std::nullptr_t> local_248;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  long local_208;
  uint local_1f8;
  undefined1 local_1e8 [32];
  RequestHook *pRStack_1c8;
  RpcClient *local_1c0;
  Builder local_58;
  
  pRVar2 = (this->connectionState).ptr;
  if ((pRVar2->connection).tag != 1) {
    kj::Exception::Exception((Exception *)local_1e8,(Exception *)&(pRVar2->connection).field_1);
    newBrokenPipeline((capnp *)&local_288,(Exception *)local_1e8);
    (__return_storage_ptr__->hook).disposer = local_288.disposer;
    (__return_storage_ptr__->hook).ptr = (PipelineHook *)local_288.ptr;
    local_288.ptr = (ClientHook *)0x0;
    (__return_storage_ptr__->ops).ptr = (PipelineOp *)0x0;
    (__return_storage_ptr__->ops).size_ = 0;
    (__return_storage_ptr__->ops).disposer = (ArrayDisposer *)0x0;
    kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose
              ((Own<capnp::PipelineHook,_std::nullptr_t> *)&local_288);
    kj::Exception::~Exception((Exception *)local_1e8);
    return __return_storage_ptr__;
  }
  pRVar3 = (this->target).ptr;
  rpc::Call::Builder::getTarget(&local_58,&this->callBuilder);
  sVar11 = local_58._builder._32_8_;
  (*(pRVar3->super_ClientHook)._vptr_ClientHook[10])
            ((Own<capnp::ClientHook,_std::nullptr_t> *)local_1e8,pRVar3);
  local_288.disposer = (Disposer *)local_1e8._0_8_;
  local_288.ptr = (ClientHook *)local_1e8._8_8_;
  local_1e8._8_8_ = (QuestionRef *)0x0;
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)local_1e8);
  pCVar6 = local_288.ptr;
  if ((QuestionRef *)local_288.ptr == (QuestionRef *)0x0) {
    if (((this->connectionState).ptr)->gotReturnForHighQuestionId == true) {
      send((RpcRequest *)local_1e8,(int)this,__buf,local_58._builder._32_8_,in_R8D);
      (__return_storage_ptr__->hook).disposer = (Disposer *)local_1e8._8_8_;
      (__return_storage_ptr__->hook).ptr = (PipelineHook *)local_1e8._16_8_;
      local_1e8._16_8_ = (WirePointer *)0x0;
      (__return_storage_ptr__->ops).ptr = (PipelineOp *)local_1e8._24_8_;
      (__return_storage_ptr__->ops).size_ = (size_t)pRStack_1c8;
      (__return_storage_ptr__->ops).disposer = (ArrayDisposer *)local_1c0;
      local_1e8._24_8_ = (RpcConnectionState *)0x0;
      pRStack_1c8 = (RequestHook *)0x0;
      RemotePromise<capnp::AnyPointer>::~RemotePromise
                ((RemotePromise<capnp::AnyPointer> *)local_1e8);
    }
    else {
      sendForPipelineInternal((RpcRequest *)local_1e8);
      kj::
      refcounted<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
                ((kj *)&local_258,(this->connectionState).ptr,
                 (Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
                 local_1e8);
      pRVar7 = local_258.ptr;
      local_248.disposer = local_258.disposer;
      local_258.ptr = (RpcPipeline *)0x0;
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t>::dispose
                (&local_258);
      (__return_storage_ptr__->hook).disposer = local_258.disposer;
      (__return_storage_ptr__->hook).ptr = &pRVar7->super_PipelineHook;
      local_248.ptr = (PipelineHook *)0x0;
      (__return_storage_ptr__->ops).ptr = (PipelineOp *)0x0;
      (__return_storage_ptr__->ops).size_ = 0;
      (__return_storage_ptr__->ops).disposer = (ArrayDisposer *)0x0;
      kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose(&local_248);
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::dispose
                ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
                 local_1e8);
    }
    goto LAB_002bd79c;
  }
  pvVar4 = (this->callBuilder)._builder.data;
  uVar5 = *(undefined8 *)((long)pvVar4 + 8);
  uVar1 = *(ushort *)((long)pvVar4 + 4);
  MVar10 = AnyPointer::Builder::targetSize(&this->paramsBuilder);
  local_268 = MVar10.wordCount;
  local_270[0] = 1;
  local_260 = MVar10.capCount;
  StructBuilder::asReader(&(this->callBuilder)._builder);
  if (local_1f8 < 0x82) {
    bVar8 = 0;
LAB_002bd6ae:
    uVar9 = 0;
  }
  else {
    bVar8 = *(byte *)(local_208 + 0x10) >> 1 & 1;
    if (local_1f8 == 0x82) goto LAB_002bd6ae;
    uVar9 = (*(byte *)(local_208 + 0x10) & 4) << 6;
  }
  (**(((Refcounted *)&pCVar6->_vptr_ClientHook)->super_Disposer)._vptr_Disposer)
            (local_1e8,pCVar6,uVar5,(ulong)uVar1,local_270,(ulong)(uVar9 | bVar8),
             local_58._builder.segment._0_4_,local_58._builder.capTable._0_4_,
             local_58._builder.data._0_4_,local_58._builder.pointers._0_4_,sVar11);
  PointerBuilder::asReader(&(this->paramsBuilder).builder);
  other.capTable._0_4_ = (int)uStack_230;
  other.segment = (SegmentReader *)local_238;
  other.capTable._4_4_ = (int)((ulong)uStack_230 >> 0x20);
  other.pointer._0_4_ = (int)local_228;
  other.pointer._4_4_ = (int)((ulong)local_228 >> 0x20);
  other.nestingLimit = (int)uStack_220;
  other._28_4_ = (int)((ulong)uStack_220 >> 0x20);
  PointerBuilder::copyFrom((PointerBuilder *)local_1e8,other,false);
  Request<capnp::AnyPointer,_capnp::AnyPointer>::sendForPipeline
            (__return_storage_ptr__,(Request<capnp::AnyPointer,_capnp::AnyPointer> *)local_1e8);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose
            ((Own<capnp::RequestHook,_std::nullptr_t> *)(local_1e8 + 0x18));
LAB_002bd79c:
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_288);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Pipeline sendForPipeline() override {
      if (!connectionState->connection.is<Connected>()) {
        // Connection is broken.
        // TODO(bug): Seems like we should check for redirect before this?
        const kj::Exception& e = connectionState->connection.get<Disconnected>();
        return AnyPointer::Pipeline(newBrokenPipeline(kj::cp(e)));
      }

      KJ_IF_SOME(redirect, target->writeTarget(callBuilder.getTarget())) {
        // Whoops, this capability has been redirected while we were building the request!
        // We'll have to make a new request and do a copy.  Ick.

        auto replacement = redirect->newCall(
            callBuilder.getInterfaceId(), callBuilder.getMethodId(), paramsBuilder.targetSize(),
            callHintsFromReader(callBuilder));
        replacement.set(paramsBuilder);
        return replacement.sendForPipeline();
      } else if (connectionState->gotReturnForHighQuestionId) {
        // Peer doesn't implement our hints. Fall back to a regular send().
        return send();
      } else {
        auto questionRef = sendForPipelineInternal();
        kj::Own<PipelineHook> pipeline = kj::refcounted<RpcPipeline>(
            *connectionState, kj::mv(questionRef));
        return AnyPointer::Pipeline(kj::mv(pipeline));
      }